

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlib.c
# Opt level: O3

void outbits(Outbuf *out,unsigned_long bits,int nbits)

{
  int iVar1;
  ulong uVar2;
  
  iVar1 = nbits + out->noutbits;
  if (iVar1 < 0x21) {
    uVar2 = bits << ((byte)out->noutbits & 0x3f) | out->outbits;
    out->outbits = uVar2;
    out->noutbits = iVar1;
    if (7 < iVar1) {
      do {
        BinarySink_put_byte(out->outbuf->binarysink_,(uchar)uVar2);
        uVar2 = out->outbits >> 8;
        out->outbits = uVar2;
        iVar1 = out->noutbits;
        out->noutbits = iVar1 + -8;
      } while (0xf < iVar1);
    }
    return;
  }
  __assert_fail("out->noutbits + nbits <= 32",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/zlib.c",0x161
                ,"void outbits(struct Outbuf *, unsigned long, int)");
}

Assistant:

static void outbits(struct Outbuf *out, unsigned long bits, int nbits)
{
    assert(out->noutbits + nbits <= 32);
    out->outbits |= bits << out->noutbits;
    out->noutbits += nbits;
    while (out->noutbits >= 8) {
        put_byte(out->outbuf, out->outbits & 0xFF);
        out->outbits >>= 8;
        out->noutbits -= 8;
    }
}